

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O1

void DspReverb_Reset(DspReverb *reverb)

{
  uint uVar1;
  long lVar2;
  float **ppfVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  
  (reverb->early_delay).read_idx = 0;
  (reverb->early_delay).write_idx = (reverb->early_delay).delay;
  SDL_memset((reverb->early_delay).buffer,0,(ulong)(reverb->early_delay).capacity << 2);
  reverb->apf_in[0].delay.read_idx = 0;
  uVar1 = reverb->apf_in[0].delay.capacity;
  reverb->apf_in[0].delay.write_idx = reverb->apf_in[0].delay.delay;
  SDL_memset(reverb->apf_in[0].delay.buffer,0,(ulong)uVar1 << 2);
  if (0 < reverb->reverb_channels) {
    pfVar5 = reverb->channel[0].lpf_comb[0].high_shelving.delay;
    ppfVar3 = &reverb->channel[0].apf_out[0].delay.buffer;
    lVar2 = 0;
    do {
      reverb->channel[lVar2].reverb_delay.read_idx = 0;
      uVar1 = reverb->channel[lVar2].reverb_delay.capacity;
      reverb->channel[lVar2].reverb_delay.write_idx = reverb->channel[lVar2].reverb_delay.delay;
      SDL_memset(reverb->channel[lVar2].reverb_delay.buffer,0,(ulong)uVar1 << 2);
      lVar4 = 8;
      pfVar6 = pfVar5;
      do {
        pfVar6[-0x1b] = 0.0;
        pfVar6[-0x1a] = pfVar6[-0x1c];
        SDL_memset(*(undefined8 *)(pfVar6 + -0x18),0,(ulong)(uint)pfVar6[-0x1d] << 2);
        SDL_memset(pfVar6 + -0xb,0,8);
        SDL_memset(pfVar6,0,8);
        pfVar6 = pfVar6 + 0x20;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      SDL_memset(reverb->channel[lVar2].room_high_shelf.delay,0,8);
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppfVar3 + lVar4 + -0xc) = 0;
        *(undefined4 *)((long)ppfVar3 + lVar4 + -8) = *(undefined4 *)((long)ppfVar3 + lVar4 + -0x10)
        ;
        SDL_memset(*(undefined8 *)((long)ppfVar3 + lVar4),0,
                   (ulong)*(uint *)((long)ppfVar3 + lVar4 + -0x14) << 2);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0xa0);
      lVar2 = lVar2 + 1;
      pfVar5 = pfVar5 + 0x13e;
      ppfVar3 = ppfVar3 + 0x9f;
    } while (lVar2 < reverb->reverb_channels);
  }
  return;
}

Assistant:

void DspReverb_Reset(DspReverb *reverb)
{
	int32_t i, c;

	DspDelay_Reset(&reverb->early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; ++i)
	{
		DspAllPass_Reset(&reverb->apf_in[i]);
	}

	for (c = 0; c < reverb->reverb_channels; ++c)
	{
		DspDelay_Reset(&reverb->channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; ++i)
		{
			DspCombShelving_Reset(&reverb->channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&reverb->channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; ++i)
		{
			DspAllPass_Reset(&reverb->channel[c].apf_out[i]);
		}
	}
}